

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Endpoints.cpp
# Opt level: O1

bool soul::isParameterInput(EndpointDetails *details)

{
  MainType MVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  string local_60;
  string local_40;
  
  if (details->endpointType == event) {
    iVar3 = std::__cxx11::string::compare((char *)&details->name);
    bVar4 = false;
    if ((iVar3 != 0) && ((details->dataTypes).numActive == 1)) {
      MVar1 = ((details->dataTypes).items)->mainType;
      bVar4 = MVar1 == boolean || ((MVar1 & 0xef) - int32 & 0xfb) == 0;
    }
  }
  else {
    if (details->endpointType == stream) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"name","");
      bVar2 = Annotation::hasValue(&details->annotation,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar2 = false;
    }
    bVar4 = true;
    if (bVar2 == false) {
      if (details->endpointType == value) {
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"name","");
        bVar4 = Annotation::hasValue(&details->annotation,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar4 = false;
      }
    }
  }
  return bVar4;
}

Assistant:

bool isParameterInput (const EndpointDetails& details)
{
    if (isEvent (details))
    {
        if (isConsoleEndpoint (details.name))
            return false;

        if (details.dataTypes.size() != 1)
            return false;

        return details.dataTypes.front().isPrimitive();
    }

    if (isStream (details) && details.annotation.hasValue ("name"))
        return true;

    if (isValue (details) && details.annotation.hasValue ("name"))
        return true;

    return false;
}